

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::Emit2ArgsOP(SQCompiler *this,SQOpcode op,SQInteger p3)

{
  SQFuncState *this_00;
  SQInteger SVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  SQInstruction local_30;
  
  SVar1 = SQFuncState::PopTarget(this->_fs);
  SVar2 = SQFuncState::PopTarget(this->_fs);
  this_00 = this->_fs;
  SVar3 = SQFuncState::PushTarget(this_00,-1);
  local_30._arg0 = (uchar)SVar3;
  local_30._arg1 = (SQInt32)SVar2;
  local_30._arg2 = (uchar)SVar1;
  local_30._arg3 = (uchar)p3;
  local_30.op = (uchar)op;
  SQFuncState::AddInstruction(this_00,&local_30);
  return;
}

Assistant:

void Emit2ArgsOP(SQOpcode op, SQInteger p3 = 0)
    {
        SQInteger p2 = _fs->PopTarget(); //src in OP_GET
        SQInteger p1 = _fs->PopTarget(); //key in OP_GET
        _fs->AddInstruction(op,_fs->PushTarget(), p1, p2, p3);
    }